

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemotelyControlledSampler.h
# Opt level: O0

void __thiscall
jaegertracing::samplers::RemotelyControlledSampler::~RemotelyControlledSampler
          (RemotelyControlledSampler *this)

{
  RemotelyControlledSampler *this_local;
  
  ~RemotelyControlledSampler(this);
  operator_delete(this);
  return;
}

Assistant:

~RemotelyControlledSampler() { close(); }